

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginDataSegment
          (BinaryReaderInterp *this,Index index,Index memory_index,uint8_t flags)

{
  State *pSVar1;
  Result RVar2;
  Enum EVar3;
  SegmentKind kind;
  Location loc_1;
  Location loc;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_1d8;
  undefined1 local_1b8 [32];
  long local_198;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_190;
  vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> local_178;
  u32 local_160;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> local_158;
  undefined1 local_138 [32];
  undefined **local_118;
  ExternKind local_110;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_108;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_f0;
  vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> local_d8;
  u32 local_c0;
  vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> local_b8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_98;
  Var local_78;
  
  kind = Declared;
  if ((~(uint)flags & 3) != 0) {
    kind = flags & Passive;
  }
  local_138._24_4_ = 0;
  local_138._0_8_ = (this->filename_)._M_len;
  local_138._8_8_ = (this->filename_)._M_str;
  pSVar1 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_138._16_8_ = pSVar1->offset;
  local_1b8._24_4_ = 0;
  local_1b8._0_8_ = (this->filename_)._M_len;
  local_1b8._8_8_ = (this->filename_)._M_str;
  local_1b8._16_8_ = pSVar1->offset;
  Var::Var(&local_78,memory_index,(Location *)local_1b8);
  RVar2 = SharedValidator::OnDataSegment(&this->validator_,(Location *)local_138,&local_78,kind);
  Var::~Var(&local_78);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(8);
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    (local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
     super__Vector_impl_data._M_start)->enum_ = I32;
    (local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
     super__Vector_impl_data._M_start)->type_index_ = 0xffffffff;
    local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
    local_1b8._0_8_ = &PTR__FuncType_0022c890;
    local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_1b8 + 0x10),&local_1d8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_190,&local_98);
    local_178.super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_160 = 0xffffffff;
    local_158.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.
    super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_138._0_8_ = (pointer)0x0;
    local_138._8_8_ = (pointer)0x0;
    local_138._16_8_ = 0;
    local_110 = local_1b8._8_4_;
    local_118 = &PTR__FuncType_0022c890;
    local_138._24_4_ = kind;
    local_138._28_4_ = memory_index;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_108,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_1b8 + 0x10));
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_f0,&local_190);
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
              (&local_d8,&local_178);
    local_c0 = local_160;
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              (&local_b8,&local_158);
    std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::push_back
              (&this->module_->datas,(value_type *)local_138);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&local_b8);
    if (local_d8.
        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.
                      super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_118 = &PTR__FuncType_0022c890;
    if (local_f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_138._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
    }
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::~vector
              (&local_158);
    if (local_178.
        super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.
                      super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_178.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.
                            super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_1b8._0_8_ = &PTR__FuncType_0022c890;
    if (local_190.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_190.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_190.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b8._16_8_ != 0) {
      operator_delete((void *)local_1b8._16_8_,local_198 - local_1b8._16_8_);
    }
    EVar3 = Ok;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderInterp::BeginDataSegment(Index index,
                                            Index memory_index,
                                            uint8_t flags) {
  auto mode = ToSegmentMode(flags);
  CHECK_RESULT(validator_.OnDataSegment(
      GetLocation(), Var(memory_index, GetLocation()), mode));

  FuncDesc init_func{
      FuncType{{}, {ValueType::I32}}, {}, Istream::kInvalidOffset, {}};
  DataDesc desc{{}, mode, memory_index, init_func};
  module_.datas.push_back(desc);
  return Result::Ok;
}